

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int hkdf_expand_label(ptls_hash_algorithm_t *algo,void *output,size_t outlen,ptls_iovec_t secret,
                     char *label,ptls_iovec_t hash_value,char *label_prefix)

{
  ptls_iovec_t info;
  ptls_iovec_t prk;
  uint8_t *__ptr;
  size_t sVar1;
  size_t sVar2;
  int iVar3;
  size_t sVar4;
  int iVar5;
  uint8_t hkdf_label_buf [512];
  ptls_buffer_t local_298;
  size_t local_270;
  ptls_hash_algorithm_t *local_268;
  void *local_260;
  uint8_t *local_258;
  size_t local_250;
  uint8_t *local_248;
  size_t sStack_240;
  uint8_t local_238 [520];
  
  local_250 = secret.len;
  local_258 = secret.base;
  if (label_prefix == (char *)0x0) {
    __assert_fail("label_prefix != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/lib/picotls.c"
                  ,0x13b8,
                  "int hkdf_expand_label(ptls_hash_algorithm_t *, void *, size_t, ptls_iovec_t, const char *, ptls_iovec_t, const char *)"
                 );
  }
  local_298.base = local_238;
  local_298.off = 0;
  local_298.capacity = 0x200;
  local_298._24_8_ = local_298._24_8_ & 0xffffffff00000000;
  local_268 = algo;
  local_260 = output;
  iVar3 = ptls_buffer_reserve(&local_298,2);
  if (iVar3 == 0) {
    *(ushort *)(local_298.base + local_298.off) = (ushort)outlen << 8 | (ushort)outlen >> 8;
    local_298.off = local_298.off + 2;
    iVar3 = 0;
  }
  if (iVar3 == 0) {
    iVar3 = ptls_buffer_reserve(&local_298,1);
    if (iVar3 == 0) {
      local_298.base[local_298.off] = '\0';
      local_298.off = local_298.off + 1;
      iVar3 = 0;
    }
    iVar5 = 6;
    if (iVar3 == 0) {
      local_270 = local_298.off;
      sVar4 = strlen(label_prefix);
      iVar3 = 0;
      if ((sVar4 != 0) &&
         (iVar3 = ptls_buffer_reserve(&local_298,sVar4), sVar1 = local_298.off, iVar3 == 0)) {
        memcpy(local_298.base + local_298.off,label_prefix,sVar4);
        local_298.off = sVar4 + sVar1;
        iVar3 = 0;
      }
      if (iVar3 == 0) {
        sVar4 = strlen(label);
        iVar3 = 0;
        if ((sVar4 != 0) &&
           (iVar3 = ptls_buffer_reserve(&local_298,sVar4), sVar1 = local_298.off, iVar3 == 0)) {
          memcpy(local_298.base + local_298.off,label,sVar4);
          local_298.off = sVar4 + sVar1;
          iVar3 = 0;
        }
        if (iVar3 == 0) {
          local_298.base[local_270 - 1] = (char)local_298.off - (char)local_270;
          iVar5 = 0;
          iVar3 = 0;
        }
      }
    }
    if (iVar5 != 6) {
      if (iVar5 != 0) {
        return iVar3;
      }
      iVar3 = ptls_buffer_reserve(&local_298,1);
      if (iVar3 == 0) {
        local_298.base[local_298.off] = '\0';
        local_298.off = local_298.off + 1;
        iVar3 = 0;
      }
      sVar1 = local_298.off;
      iVar5 = 6;
      if (iVar3 == 0) {
        iVar3 = 0;
        if ((hash_value.len != 0) &&
           (iVar3 = ptls_buffer_reserve(&local_298,hash_value.len), sVar2 = local_298.off,
           iVar3 == 0)) {
          memcpy(local_298.base + local_298.off,hash_value.base,hash_value.len);
          local_298.off = sVar2 + hash_value.len;
          iVar3 = 0;
        }
        if (iVar3 == 0) {
          local_298.base[sVar1 - 1] = (char)local_298.off - (char)sVar1;
          iVar5 = 0;
          iVar3 = 0;
        }
      }
      if (iVar5 != 6) {
        if (iVar5 != 0) {
          return iVar3;
        }
        local_248 = local_298.base;
        sStack_240 = local_298.off;
        prk.len = local_250;
        prk.base = local_258;
        info.len = local_298.off;
        info.base = local_298.base;
        iVar3 = ptls_hkdf_expand(local_268,local_260,outlen,prk,info);
      }
    }
  }
  __ptr = local_298.base;
  (*ptls_clear_memory)(local_298.base,local_298.off);
  if (local_298.is_allocated != 0) {
    free(__ptr);
  }
  return iVar3;
}

Assistant:

int hkdf_expand_label(ptls_hash_algorithm_t *algo, void *output, size_t outlen, ptls_iovec_t secret, const char *label,
                      ptls_iovec_t hash_value, const char *label_prefix)
{
    ptls_buffer_t hkdf_label;
    uint8_t hkdf_label_buf[512];
    int ret;

    assert(label_prefix != NULL);

    ptls_buffer_init(&hkdf_label, hkdf_label_buf, sizeof(hkdf_label_buf));

    ptls_buffer_push16(&hkdf_label, (uint16_t)outlen);
    ptls_buffer_push_block(&hkdf_label, 1, {
        ptls_buffer_pushv(&hkdf_label, label_prefix, strlen(label_prefix));
        ptls_buffer_pushv(&hkdf_label, label, strlen(label));
    });
    ptls_buffer_push_block(&hkdf_label, 1, { ptls_buffer_pushv(&hkdf_label, hash_value.base, hash_value.len); });

    ret = ptls_hkdf_expand(algo, output, outlen, secret, ptls_iovec_init(hkdf_label.base, hkdf_label.off));

Exit:
    ptls_buffer_dispose(&hkdf_label);
    return ret;
}